

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

void __thiscall
kratos::InterfaceModPortDefinition::InterfaceModPortDefinition
          (InterfaceModPortDefinition *this,shared_ptr<kratos::InterfaceDefinition> *def,
          string *name)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_IDefinition)._vptr_IDefinition = (_func_int **)&PTR_has_port_002a9648;
  (this->def_).super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (def->super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->def_).super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (def->super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (def->super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->def_).super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (def->super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  p_Var1 = &(this->inputs_)._M_t._M_impl.super__Rb_tree_header;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->inputs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->outputs_)._M_t._M_impl.super__Rb_tree_header;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->outputs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

InterfaceModPortDefinition::InterfaceModPortDefinition(
    std::shared_ptr<kratos::InterfaceDefinition> def, std::string name)
    : def_(std::move(def)), name_(std::move(name)) {}